

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonLexer.cpp
# Opt level: O2

void __thiscall json::JsonToken::JsonToken(JsonToken *this,JsonTokenType type,string *value)

{
  this->type = type;
  std::__cxx11::string::string((string *)&this->value,(string *)value);
  return;
}

Assistant:

JsonToken::JsonToken(JsonTokenType type, std::string &&value) : type(type), value(std::move(value))
    {
    }